

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayof.c
# Opt level: O1

void tommy_arrayof_init(tommy_arrayof *array,tommy_size_t element_size)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array->element_size = element_size;
  array->bucket_bit = 6;
  array->bucket_max = 0x40;
  pvVar2 = lrtr_calloc(0x40,element_size);
  array->bucket[0] = pvVar2;
  lVar3 = 1;
  do {
    array->bucket[lVar3] = pvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayof_init(tommy_arrayof* array, tommy_size_t element_size)
{
	tommy_uint_t i;

	/* fixed initial size */
	array->element_size = element_size;
	array->bucket_bit = TOMMY_ARRAYOF_BIT;
	array->bucket_max = 1 << array->bucket_bit;
	array->bucket[0] = tommy_calloc(array->bucket_max, array->element_size);
	for (i = 1; i < TOMMY_ARRAYOF_BIT; ++i)
		array->bucket[i] = array->bucket[0];

	array->count = 0;
}